

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O2

void loadable_extension_demo_init(DatabaseInstance *db)

{
  ScalarFunction SVar1;
  ScalarFunction SVar2;
  ScalarFunction SVar3;
  ScalarFunction SVar4;
  ScalarFunction SVar5;
  ScalarFunction SVar6;
  ScalarFunction SVar7;
  ScalarFunction SVar8;
  ScalarFunction SVar9;
  ScalarFunction SVar10;
  TableFunction TVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  CreateFunctionInfo *pCVar14;
  ClientContext *pCVar15;
  pointer pCVar16;
  CatalogEntry *pCVar17;
  mapped_type *pmVar18;
  long lVar19;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  initializer_list<duckdb::LogicalType> __l_04;
  initializer_list<duckdb::LogicalType> __l_05;
  initializer_list<duckdb::LogicalType> __l_06;
  initializer_list<duckdb::LogicalType> __l_07;
  undefined4 uStack_28a4;
  undefined4 uStack_289c;
  undefined8 uStack_2890;
  _Head_base<0UL,_duckdb::CreateTypeInfo_*,_false> local_2888;
  long *local_2880;
  long *local_2878;
  long *local_2870;
  LogicalType minmax_type;
  LogicalType bounded_type;
  LogicalType target_type;
  allocator local_2820 [24];
  child_list_t<LogicalType> child_types;
  LogicalType bounded_specialized_type;
  undefined8 uStack_27e8;
  undefined8 uStack_27e0;
  BoundCastInfo local_27d8 [16];
  long *local_27c8;
  BoundCastInfo local_27c0 [16];
  long *local_27b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_27a8;
  undefined8 uStack_27a0;
  long *local_2798;
  optional_ptr<duckdb::CatalogEntry,_true> sub_point_entry;
  optional_ptr<duckdb::CatalogEntry,_true> add_point_entry;
  optional_ptr<duckdb::CatalogEntry,_true> type_entry;
  code *local_2778 [2];
  code *local_2768;
  code *local_2760;
  code *local_2758 [2];
  code *local_2748;
  code *local_2740;
  code *local_2738 [2];
  code *local_2728;
  code *local_2720;
  code *local_2718 [2];
  code *local_2708;
  code *local_2700;
  code *local_26f8 [2];
  code *local_26e8;
  code *local_26e0;
  code *local_26d8 [2];
  code *local_26c8;
  code *local_26c0;
  code *local_26b8 [2];
  code *local_26a8;
  code *local_26a0;
  code *local_2698 [2];
  code *local_2688;
  code *local_2680;
  code *local_2678 [2];
  code *local_2668;
  code *local_2660;
  Connection con;
  code *local_2638 [2];
  code *local_2628;
  code *local_2620;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2618;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_25f8;
  LogicalType local_25e0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_25c8;
  LogicalType local_25b0 [24];
  LogicalType local_2598 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2580;
  LogicalType local_2568 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2550;
  LogicalType local_2538 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2520;
  LogicalType local_2508 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_24f0;
  LogicalType local_24d8 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_24c0;
  LogicalType local_24a8 [24];
  LogicalType local_2490 [24];
  LogicalType local_2478 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2460;
  LogicalType local_2448 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2430;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  local_2418;
  LogicalType local_2400 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_23e8;
  LogicalType local_23d0 [24];
  string alias_name;
  LogicalType local_2398 [24];
  string local_2380 [32];
  string local_2360 [32];
  LogicalType local_2340 [24];
  string local_2328 [32];
  LogicalType local_2308 [24];
  string local_22f0 [32];
  LogicalType local_22d0 [24];
  string local_22b8 [32];
  LogicalType local_2298 [24];
  string local_2280 [32];
  LogicalType local_2260 [24];
  string local_2248 [32];
  string local_2228 [32];
  LogicalType local_2208 [24];
  string local_21f0 [32];
  LogicalType local_21d0 [24];
  string local_21b8 [32];
  LogicalType local_2198 [24];
  string local_2180 [32];
  string local_2160 [32];
  LogicalType local_2140 [24];
  string local_2128 [32];
  CreateScalarFunctionInfo add_point_info;
  LogicalType local_20f0 [416];
  CreateScalarFunctionInfo sub_point_info;
  LogicalType local_1f38 [416];
  ScalarFunction bounded_invert;
  ScalarFunction bounded_max;
  CreateScalarFunctionInfo loaded_extensions_info;
  ScalarFunction bounded_even;
  ScalarFunction bounded_to_ascii;
  ScalarFunction bounded_add;
  QuackFunction quack_function;
  ScalarFunction local_1460;
  ScalarFunction local_1338;
  ScalarFunction local_1210;
  ScalarFunction local_10e8;
  ScalarFunction local_fc0;
  ScalarFunction local_e98;
  ScalarFunction local_d70;
  ScalarFunction loaded_extensions;
  ScalarFunction local_b20;
  ScalarFunction sub_point_func;
  ScalarFunction local_8d0;
  ScalarFunction add_point_func;
  ScalarFunction local_680;
  TableFunction local_558;
  CreateTableFunctionInfo quack_info;
  CreateScalarFunctionInfo hello_alias_info;
  
  std::__cxx11::string::string(local_2128,"test_alias_hello",(allocator *)&add_point_info);
  local_25f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_25f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_25f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duckdb::LogicalType::LogicalType(local_23d0,VARCHAR);
  local_2638[1] = (code *)0x0;
  local_2638[0] = TestAliasHello;
  local_2620 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_invoke;
  local_2628 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_manager;
  duckdb::LogicalType::LogicalType(local_2140,INVALID);
  duckdb::ScalarFunction::ScalarFunction(&local_680,local_2128,&local_25f8,local_23d0,local_2638,0);
  SVar1._16_8_ = 0;
  SVar1.super_BaseScalarFunction = (BaseScalarFunction)0x0;
  SVar1._1_8_ = 0;
  SVar1._9_7_ = 0;
  SVar1._24_8_ = local_2140;
  SVar1._32_4_ = 0;
  SVar1._36_4_ = uStack_28a4;
  SVar1._40_4_ = 0;
  SVar1._44_4_ = uStack_289c;
  SVar1._48_8_ = 0;
  SVar1._56_8_ = uStack_2890;
  SVar1._64_8_ = local_2888._M_head_impl;
  SVar1._72_8_ = local_2880;
  SVar1._80_8_ = local_2878;
  SVar1._88_8_ = local_2870;
  SVar1._96_96_ = _minmax_type;
  SVar1.function.super__Function_base._M_manager =
       (_Manager_type)
       child_types.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  SVar1.function._M_invoker =
       (_Invoker_type)
       child_types.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  SVar1.bind = (bind_scalar_function_t)
               child_types.
               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               .
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  SVar1.bind_extended = (bind_scalar_function_extended_t)_bounded_specialized_type;
  SVar1.init_local_state = (init_local_state_t)uStack_27e8;
  SVar1.statistics = (function_statistics_t)uStack_27e0;
  SVar1.bind_lambda = (bind_lambda_function_t)local_27d8._0_8_;
  SVar1.bind_expression = (function_bind_expression_t)local_27d8._8_8_;
  SVar1.get_modified_databases = (get_modified_databases_t)local_27c8;
  SVar1._264_16_ = local_27c0;
  SVar1.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_27b0;
  SVar1.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_27a8._M_pi;
  duckdb::CreateScalarFunctionInfo::CreateScalarFunctionInfo(&hello_alias_info,SVar1);
  duckdb::ScalarFunction::~ScalarFunction(&local_680);
  duckdb::LogicalType::~LogicalType(local_2140);
  std::_Function_base::~_Function_base((_Function_base *)local_2638);
  duckdb::LogicalType::~LogicalType(local_23d0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_25f8);
  std::__cxx11::string::~string(local_2128);
  duckdb::Connection::Connection(&con,db);
  pCVar14 = (CreateFunctionInfo *)
            duckdb::shared_ptr<duckdb::ClientContext,_true>::operator*
                      ((shared_ptr<duckdb::ClientContext,_true> *)&con);
  pCVar15 = (ClientContext *)duckdb::Catalog::GetSystemCatalog((ClientContext *)pCVar14);
  duckdb::Connection::BeginTransaction();
  std::__cxx11::string::string
            ((string *)&add_point_info,"hello",(allocator *)&loaded_extensions_info);
  duckdb::LogicalType::LogicalType((LogicalType *)&sub_point_info,VARCHAR);
  __l._M_len = 1;
  __l._M_array = (iterator)&sub_point_info;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_23e8,__l,(allocator_type *)&quack_function);
  duckdb::LogicalType::LogicalType(local_2400,INTEGER);
  duckdb::Connection::CreateScalarFunction<int,duckdb::string_t>
            (&con,(string *)&add_point_info,(vector<duckdb::LogicalType,_true> *)&local_23e8,
             local_2400,hello_fun);
  duckdb::LogicalType::~LogicalType(local_2400);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_23e8);
  duckdb::LogicalType::~LogicalType((LogicalType *)&sub_point_info);
  std::__cxx11::string::~string((string *)&add_point_info);
  duckdb::Catalog::CreateFunction(pCVar15,pCVar14);
  std::__cxx11::string::string((string *)&alias_name,"POINT",(allocator *)&add_point_info);
  child_types.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  child_types.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  child_types.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _sub_point_info = "x";
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_*,_duckdb::LogicalTypeId,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)&add_point_info,(pair<const_char_*,_duckdb::LogicalTypeId> *)&sub_point_info);
  std::
  vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
            ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
              *)&child_types,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)&add_point_info);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
           *)&add_point_info);
  _sub_point_info = "y";
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_*,_duckdb::LogicalTypeId,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)&add_point_info,(pair<const_char_*,_duckdb::LogicalTypeId> *)&sub_point_info);
  std::
  vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
            ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
              *)&child_types,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)&add_point_info);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
           *)&add_point_info);
  duckdb::make_uniq<duckdb::CreateTypeInfo>();
  pCVar16 = duckdb::
            unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
            operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                        *)&local_2888);
  pCVar16[0x52] = (CreateTypeInfo)0x1;
  pCVar16 = duckdb::
            unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
            operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                        *)&local_2888);
  std::__cxx11::string::_M_assign((string *)(pCVar16 + 0x128));
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::vector(&local_2418,
           &child_types.
            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          );
  duckdb::LogicalType::STRUCT(&target_type,&local_2418);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector(&local_2418);
  std::__cxx11::string::string(local_2160,(string *)&alias_name);
  duckdb::LogicalType::SetAlias(&target_type,local_2160);
  std::__cxx11::string::~string(local_2160);
  pCVar16 = duckdb::
            unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
            operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                        *)&local_2888);
  duckdb::LogicalType::operator=((LogicalType *)(pCVar16 + 0x148),&target_type);
  duckdb::unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
  operator*((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true> *
            )&local_2888);
  _type_entry = duckdb::Catalog::CreateType(pCVar15,(CreateTypeInfo *)pCVar14);
  pCVar17 = duckdb::optional_ptr<duckdb::CatalogEntry,_true>::operator->(&type_entry);
  std::__cxx11::string::string((string *)&add_point_info,"ext:name",(allocator *)&sub_point_info);
  pmVar18 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)(pCVar17 + 0x90),(key_type *)&add_point_info);
  std::__cxx11::string::assign((char *)pmVar18);
  std::__cxx11::string::~string((string *)&add_point_info);
  pCVar17 = duckdb::optional_ptr<duckdb::CatalogEntry,_true>::operator->(&type_entry);
  std::__cxx11::string::string((string *)&add_point_info,"ext:author",(allocator *)&sub_point_info);
  pmVar18 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)(pCVar17 + 0x90),(key_type *)&add_point_info);
  std::__cxx11::string::assign((char *)pmVar18);
  std::__cxx11::string::~string((string *)&add_point_info);
  std::__cxx11::string::string(local_2180,"add_point",(allocator *)&sub_point_info);
  duckdb::LogicalType::LogicalType((LogicalType *)&add_point_info,&target_type);
  duckdb::LogicalType::LogicalType(local_20f0,&target_type);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&add_point_info;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_2430,__l_00,(allocator_type *)&loaded_extensions_info);
  duckdb::LogicalType::LogicalType(local_2448,&target_type);
  local_2678[1] = (code *)0x0;
  local_2678[0] = AddPointFunction;
  local_2660 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_invoke;
  local_2668 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_manager;
  duckdb::LogicalType::LogicalType(local_2198,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&add_point_func,local_2180,&local_2430,local_2448,local_2678,0);
  duckdb::LogicalType::~LogicalType(local_2198);
  std::_Function_base::~_Function_base((_Function_base *)local_2678);
  duckdb::LogicalType::~LogicalType(local_2448);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2430);
  lVar19 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType((LogicalType *)(&add_point_info + lVar19));
    lVar19 = lVar19 + -0x18;
  } while (lVar19 != -0x18);
  std::__cxx11::string::~string(local_2180);
  duckdb::ScalarFunction::ScalarFunction(&local_8d0,&add_point_func);
  SVar2._16_8_ = 0;
  SVar2.super_BaseScalarFunction = (BaseScalarFunction)0x0;
  SVar2._1_8_ = 0;
  SVar2._9_7_ = 0;
  SVar2._24_8_ = local_2198;
  SVar2._32_4_ = 0;
  SVar2._36_4_ = uStack_28a4;
  SVar2._40_4_ = 0;
  SVar2._44_4_ = uStack_289c;
  SVar2._48_8_ = 0;
  SVar2._56_8_ = uStack_2890;
  SVar2._64_8_ = local_2888._M_head_impl;
  SVar2._72_8_ = local_2880;
  SVar2._80_8_ = local_2878;
  SVar2._88_8_ = local_2870;
  SVar2._96_96_ = _minmax_type;
  SVar2.function.super__Function_base._M_manager =
       (_Manager_type)
       child_types.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  SVar2.function._M_invoker =
       (_Invoker_type)
       child_types.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  SVar2.bind = (bind_scalar_function_t)
               child_types.
               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               .
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  SVar2.bind_extended = (bind_scalar_function_extended_t)_bounded_specialized_type;
  SVar2.init_local_state = (init_local_state_t)uStack_27e8;
  SVar2.statistics = (function_statistics_t)uStack_27e0;
  SVar2.bind_lambda = (bind_lambda_function_t)local_27d8._0_8_;
  SVar2.bind_expression = (function_bind_expression_t)local_27d8._8_8_;
  SVar2.get_modified_databases = (get_modified_databases_t)local_27c8;
  SVar2._264_16_ = local_27c0;
  SVar2.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_27b0;
  SVar2.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_27a8._M_pi;
  duckdb::CreateScalarFunctionInfo::CreateScalarFunctionInfo(&add_point_info,SVar2);
  duckdb::ScalarFunction::~ScalarFunction(&local_8d0);
  _add_point_entry = duckdb::Catalog::CreateFunction(pCVar15,pCVar14);
  pCVar17 = duckdb::optional_ptr<duckdb::CatalogEntry,_true>::operator->(&add_point_entry);
  std::__cxx11::string::string
            ((string *)&sub_point_info,"ext:name",(allocator *)&loaded_extensions_info);
  pmVar18 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)(pCVar17 + 0x90),(key_type *)&sub_point_info);
  std::__cxx11::string::assign((char *)pmVar18);
  std::__cxx11::string::~string((string *)&sub_point_info);
  pCVar17 = duckdb::optional_ptr<duckdb::CatalogEntry,_true>::operator->(&add_point_entry);
  std::__cxx11::string::string
            ((string *)&sub_point_info,"ext:author",(allocator *)&loaded_extensions_info);
  pmVar18 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)(pCVar17 + 0x90),(key_type *)&sub_point_info);
  std::__cxx11::string::assign((char *)pmVar18);
  std::__cxx11::string::~string((string *)&sub_point_info);
  std::__cxx11::string::string(local_21b8,"sub_point",(allocator *)&loaded_extensions_info);
  duckdb::LogicalType::LogicalType((LogicalType *)&sub_point_info,&target_type);
  duckdb::LogicalType::LogicalType(local_1f38,&target_type);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&sub_point_info;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_2460,__l_01,(allocator_type *)&quack_function);
  duckdb::LogicalType::LogicalType(local_2478,&target_type);
  local_2698[1] = (code *)0x0;
  local_2698[0] = SubPointFunction;
  local_2680 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_invoke;
  local_2688 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_manager;
  duckdb::LogicalType::LogicalType(local_21d0,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&sub_point_func,local_21b8,&local_2460,local_2478,local_2698,0);
  duckdb::LogicalType::~LogicalType(local_21d0);
  std::_Function_base::~_Function_base((_Function_base *)local_2698);
  duckdb::LogicalType::~LogicalType(local_2478);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2460);
  lVar19 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType((LogicalType *)(&sub_point_info + lVar19));
    lVar19 = lVar19 + -0x18;
  } while (lVar19 != -0x18);
  std::__cxx11::string::~string(local_21b8);
  duckdb::ScalarFunction::ScalarFunction(&local_b20,&sub_point_func);
  SVar3._16_8_ = 0;
  SVar3.super_BaseScalarFunction = (BaseScalarFunction)0x0;
  SVar3._1_8_ = 0;
  SVar3._9_7_ = 0;
  SVar3._24_8_ = local_21d0;
  SVar3._32_4_ = 0;
  SVar3._36_4_ = uStack_28a4;
  SVar3._40_4_ = 0;
  SVar3._44_4_ = uStack_289c;
  SVar3._48_8_ = 0;
  SVar3._56_8_ = uStack_2890;
  SVar3._64_8_ = local_2888._M_head_impl;
  SVar3._72_8_ = local_2880;
  SVar3._80_8_ = local_2878;
  SVar3._88_8_ = local_2870;
  SVar3._96_96_ = _minmax_type;
  SVar3.function.super__Function_base._M_manager =
       (_Manager_type)
       child_types.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  SVar3.function._M_invoker =
       (_Invoker_type)
       child_types.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  SVar3.bind = (bind_scalar_function_t)
               child_types.
               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               .
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  SVar3.bind_extended = (bind_scalar_function_extended_t)_bounded_specialized_type;
  SVar3.init_local_state = (init_local_state_t)uStack_27e8;
  SVar3.statistics = (function_statistics_t)uStack_27e0;
  SVar3.bind_lambda = (bind_lambda_function_t)local_27d8._0_8_;
  SVar3.bind_expression = (function_bind_expression_t)local_27d8._8_8_;
  SVar3.get_modified_databases = (get_modified_databases_t)local_27c8;
  SVar3._264_16_ = local_27c0;
  SVar3.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_27b0;
  SVar3.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_27a8._M_pi;
  duckdb::CreateScalarFunctionInfo::CreateScalarFunctionInfo(&sub_point_info,SVar3);
  duckdb::ScalarFunction::~ScalarFunction(&local_b20);
  _sub_point_entry = duckdb::Catalog::CreateFunction(pCVar15,pCVar14);
  pCVar17 = duckdb::optional_ptr<duckdb::CatalogEntry,_true>::operator->(&sub_point_entry);
  std::__cxx11::string::string
            ((string *)&loaded_extensions_info,"ext:name",(allocator *)&quack_function);
  pmVar18 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)(pCVar17 + 0x90),(key_type *)&loaded_extensions_info);
  std::__cxx11::string::assign((char *)pmVar18);
  std::__cxx11::string::~string((string *)&loaded_extensions_info);
  pCVar17 = duckdb::optional_ptr<duckdb::CatalogEntry,_true>::operator->(&sub_point_entry);
  std::__cxx11::string::string
            ((string *)&loaded_extensions_info,"ext:author",(allocator *)&quack_function);
  pmVar18 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)(pCVar17 + 0x90),(key_type *)&loaded_extensions_info);
  std::__cxx11::string::assign((char *)pmVar18);
  std::__cxx11::string::~string((string *)&loaded_extensions_info);
  std::__cxx11::string::string(local_21f0,"loaded_extensions",(allocator *)&loaded_extensions_info);
  local_2618.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2618.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2618.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duckdb::LogicalType::LogicalType(local_2490,VARCHAR);
  local_26b8[1] = (code *)0x0;
  local_26b8[0] = LoadedExtensionsFunction;
  local_26a0 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_invoke;
  local_26a8 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_manager;
  duckdb::LogicalType::LogicalType(local_2208,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&loaded_extensions,local_21f0,&local_2618,local_2490,local_26b8,0);
  duckdb::LogicalType::~LogicalType(local_2208);
  std::_Function_base::~_Function_base((_Function_base *)local_26b8);
  duckdb::LogicalType::~LogicalType(local_2490);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2618);
  std::__cxx11::string::~string(local_21f0);
  duckdb::ScalarFunction::ScalarFunction(&local_d70,&loaded_extensions);
  SVar4._16_8_ = 0;
  SVar4.super_BaseScalarFunction = (BaseScalarFunction)0x0;
  SVar4._1_8_ = 0;
  SVar4._9_7_ = 0;
  SVar4._24_8_ = local_2208;
  SVar4._32_4_ = 0;
  SVar4._36_4_ = uStack_28a4;
  SVar4._40_4_ = 0;
  SVar4._44_4_ = uStack_289c;
  SVar4._48_8_ = 0;
  SVar4._56_8_ = uStack_2890;
  SVar4._64_8_ = local_2888._M_head_impl;
  SVar4._72_8_ = local_2880;
  SVar4._80_8_ = local_2878;
  SVar4._88_8_ = local_2870;
  SVar4._96_96_ = _minmax_type;
  SVar4.function.super__Function_base._M_manager =
       (_Manager_type)
       child_types.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  SVar4.function._M_invoker =
       (_Invoker_type)
       child_types.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  SVar4.bind = (bind_scalar_function_t)
               child_types.
               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               .
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  SVar4.bind_extended = (bind_scalar_function_extended_t)_bounded_specialized_type;
  SVar4.init_local_state = (init_local_state_t)uStack_27e8;
  SVar4.statistics = (function_statistics_t)uStack_27e0;
  SVar4.bind_lambda = (bind_lambda_function_t)local_27d8._0_8_;
  SVar4.bind_expression = (function_bind_expression_t)local_27d8._8_8_;
  SVar4.get_modified_databases = (get_modified_databases_t)local_27c8;
  SVar4._264_16_ = local_27c0;
  SVar4.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_27b0;
  SVar4.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_27a8._M_pi;
  duckdb::CreateScalarFunctionInfo::CreateScalarFunctionInfo(&loaded_extensions_info,SVar4);
  duckdb::ScalarFunction::~ScalarFunction(&local_d70);
  duckdb::Catalog::CreateFunction(pCVar15,pCVar14);
  QuackFunction::QuackFunction(&quack_function);
  duckdb::TableFunction::TableFunction(&local_558,&quack_function.super_TableFunction);
  TVar11._16_8_ = 0;
  TVar11.super_SimpleNamedParameterFunction = (SimpleNamedParameterFunction)0x0;
  TVar11._1_8_ = 0;
  TVar11._9_7_ = 0;
  TVar11._24_8_ = local_2208;
  TVar11._32_4_ = 0;
  TVar11._36_4_ = uStack_28a4;
  TVar11._40_4_ = 0;
  TVar11._44_4_ = uStack_289c;
  TVar11._48_8_ = 0;
  TVar11._56_8_ = uStack_2890;
  TVar11._64_8_ = local_2888._M_head_impl;
  TVar11._72_8_ = local_2880;
  TVar11._80_8_ = local_2878;
  TVar11._88_8_ = local_2870;
  TVar11._96_96_ = _minmax_type;
  TVar11._192_8_ =
       child_types.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  TVar11.bind = (table_function_bind_t)
                child_types.
                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                .
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  TVar11.bind_replace =
       (table_function_bind_replace_t)
       child_types.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  TVar11.bind_operator = (table_function_bind_operator_t)_bounded_specialized_type;
  TVar11.init_global = (table_function_init_global_t)uStack_27e8;
  TVar11.init_local = (table_function_init_local_t)uStack_27e0;
  TVar11.function = (table_function_t)local_27d8._0_8_;
  TVar11.in_out_function = (table_in_out_function_t)local_27d8._8_8_;
  TVar11.in_out_function_final = (table_in_out_function_final_t)local_27c8;
  TVar11._264_16_ = local_27c0;
  TVar11.cardinality = (table_function_cardinality_t)local_27b0;
  TVar11.pushdown_complex_filter = (table_function_pushdown_complex_filter_t)local_27a8._M_pi;
  TVar11.pushdown_expression = (table_function_pushdown_expression_t)uStack_27a0;
  TVar11.to_string = (table_function_to_string_t)local_2798;
  TVar11.dynamic_to_string = (table_function_dynamic_to_string_t)_sub_point_entry;
  TVar11.table_scan_progress = (table_function_progress_t)_add_point_entry;
  TVar11.get_partition_data = (table_function_get_partition_data_t)_type_entry;
  TVar11.get_bind_info = local_2778[0];
  TVar11.type_pushdown = local_2778[1];
  TVar11.get_multi_file_reader = local_2768;
  TVar11.supports_pushdown_type = local_2760;
  TVar11.get_partition_info = local_2758[0];
  TVar11.get_partition_stats = local_2758[1];
  TVar11.get_virtual_columns = local_2748;
  TVar11.serialize = local_2740;
  TVar11.deserialize = local_2738[0];
  TVar11._408_8_ = local_2738[1];
  TVar11.function_info.internal.
  super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_2728;
  TVar11.function_info.internal.
  super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2720;
  TVar11._432_8_ = local_2718[0];
  duckdb::CreateTableFunctionInfo::CreateTableFunctionInfo(&quack_info,TVar11);
  duckdb::TableFunction::~TableFunction(&local_558);
  duckdb::Catalog::CreateTableFunction(pCVar15,(CreateTableFunctionInfo *)pCVar14);
  duckdb::Connection::Commit();
  lVar19 = duckdb::DBConfig::GetConfig(db);
  bounded_max._16_8_ = 0;
  bounded_max._24_8_ = 0;
  bounded_max._0_8_ = QuackExtension::QuackParseFunction;
  bounded_max._8_8_ = QuackExtension::QuackPlanFunction;
  std::vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>::
  emplace_back<duckdb::ParserExtension>
            ((vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_> *)
             (lVar19 + 0x578),(ParserExtension *)&bounded_max);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bounded_max.field_0x18);
  duckdb::make_uniq<QuackLoadExtension>();
  uVar12 = bounded_invert._0_8_;
  bounded_invert.super_BaseScalarFunction = (BaseScalarFunction)0x0;
  bounded_invert._1_7_ = 0;
  uVar13 = bounded_invert._0_8_;
  bounded_invert.super_BaseScalarFunction = SUB81(uVar12,0);
  bounded_invert._1_7_ = SUB87(uVar12,1);
  bounded_max.super_BaseScalarFunction = bounded_invert.super_BaseScalarFunction;
  bounded_max._1_7_ = bounded_invert._1_7_;
  bounded_invert._0_8_ = uVar13;
  std::
  vector<duckdb::unique_ptr<duckdb::ExtensionCallback,std::default_delete<duckdb::ExtensionCallback>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,std::default_delete<duckdb::ExtensionCallback>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExtensionCallback,std::default_delete<duckdb::ExtensionCallback>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExtensionCallback,std::default_delete<duckdb::ExtensionCallback>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,std::default_delete<duckdb::ExtensionCallback>,true>>>
              *)(lVar19 + 0x630),
             (unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>
              *)&bounded_max);
  if (bounded_max._0_8_ != 0) {
    (**(code **)(*(long *)bounded_max._0_8_ + 8))();
  }
  bounded_max.super_BaseScalarFunction = (BaseScalarFunction)0x0;
  bounded_max._1_7_ = 0;
  if (bounded_invert._0_8_ != 0) {
    (**(code **)(*(long *)bounded_invert._0_8_ + 8))();
  }
  BoundedType::GetDefault();
  std::__cxx11::string::string(local_2228,"BOUNDED",(allocator *)&bounded_max);
  duckdb::LogicalType::LogicalType(local_24a8,&bounded_type);
  duckdb::ExtensionUtil::RegisterType(db,local_2228,local_24a8,BoundedType::Bind);
  duckdb::LogicalType::~LogicalType(local_24a8);
  std::__cxx11::string::~string(local_2228);
  std::__cxx11::string::string(local_2248,"bounded_max",(allocator *)&bounded_add);
  duckdb::LogicalType::LogicalType((LogicalType *)&bounded_invert,&bounded_type);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&bounded_invert;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_24c0,__l_02,(allocator_type *)&bounded_even);
  duckdb::LogicalType::LogicalType(local_24d8,INTEGER);
  local_26d8[1] = (code *)0x0;
  local_26d8[0] = BoundedMaxFunc;
  local_26c0 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_invoke;
  local_26c8 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_manager;
  duckdb::LogicalType::LogicalType(local_2260,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&bounded_max,local_2248,&local_24c0,local_24d8,local_26d8,BoundedMaxBind);
  duckdb::LogicalType::~LogicalType(local_2260);
  std::_Function_base::~_Function_base((_Function_base *)local_26d8);
  duckdb::LogicalType::~LogicalType(local_24d8);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_24c0);
  duckdb::LogicalType::~LogicalType((LogicalType *)&bounded_invert);
  std::__cxx11::string::~string(local_2248);
  duckdb::ScalarFunction::ScalarFunction(&local_e98,&bounded_max);
  SVar5._16_8_ = 0;
  SVar5.super_BaseScalarFunction = (BaseScalarFunction)0x0;
  SVar5._1_8_ = 0;
  SVar5._9_7_ = 0;
  SVar5._24_8_ = local_2260;
  SVar5._32_4_ = 0;
  SVar5._36_4_ = uStack_28a4;
  SVar5._40_4_ = 0;
  SVar5._44_4_ = uStack_289c;
  SVar5._48_8_ = 0;
  SVar5._56_8_ = uStack_2890;
  SVar5._64_8_ = local_2888._M_head_impl;
  SVar5._72_8_ = local_2880;
  SVar5._80_8_ = local_2878;
  SVar5._88_8_ = local_2870;
  SVar5._96_96_ = _minmax_type;
  SVar5.function.super__Function_base._M_manager =
       (_Manager_type)
       child_types.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  SVar5.function._M_invoker =
       (_Invoker_type)
       child_types.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  SVar5.bind = (bind_scalar_function_t)
               child_types.
               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               .
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  SVar5.bind_extended = (bind_scalar_function_extended_t)_bounded_specialized_type;
  SVar5.init_local_state = (init_local_state_t)uStack_27e8;
  SVar5.statistics = (function_statistics_t)uStack_27e0;
  SVar5.bind_lambda = (bind_lambda_function_t)local_27d8._0_8_;
  SVar5.bind_expression = (function_bind_expression_t)local_27d8._8_8_;
  SVar5.get_modified_databases = (get_modified_databases_t)local_27c8;
  SVar5._264_16_ = local_27c0;
  SVar5.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_27b0;
  SVar5.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_27a8._M_pi;
  duckdb::ExtensionUtil::RegisterFunction(db,SVar5);
  duckdb::ScalarFunction::~ScalarFunction(&local_e98);
  std::__cxx11::string::string(local_2280,"bounded_invert",(allocator *)&bounded_even);
  duckdb::LogicalType::LogicalType((LogicalType *)&bounded_add,&bounded_type);
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&bounded_add;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_24f0,__l_03,(allocator_type *)&bounded_to_ascii);
  duckdb::LogicalType::LogicalType(local_2508,&bounded_type);
  local_26f8[1] = (code *)0x0;
  local_26f8[0] = BoundedInvertFunc;
  local_26e0 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_invoke;
  local_26e8 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_manager;
  duckdb::LogicalType::LogicalType(local_2298,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&bounded_invert,local_2280,&local_24f0,local_2508,local_26f8,BoundedInvertBind);
  duckdb::LogicalType::~LogicalType(local_2298);
  std::_Function_base::~_Function_base((_Function_base *)local_26f8);
  duckdb::LogicalType::~LogicalType(local_2508);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_24f0);
  duckdb::LogicalType::~LogicalType((LogicalType *)&bounded_add);
  std::__cxx11::string::~string(local_2280);
  duckdb::ScalarFunction::ScalarFunction(&local_fc0,&bounded_invert);
  SVar6._16_8_ = 0;
  SVar6.super_BaseScalarFunction = (BaseScalarFunction)0x0;
  SVar6._1_8_ = 0;
  SVar6._9_7_ = 0;
  SVar6._24_8_ = local_2298;
  SVar6._32_4_ = 0;
  SVar6._36_4_ = uStack_28a4;
  SVar6._40_4_ = 0;
  SVar6._44_4_ = uStack_289c;
  SVar6._48_8_ = 0;
  SVar6._56_8_ = uStack_2890;
  SVar6._64_8_ = local_2888._M_head_impl;
  SVar6._72_8_ = local_2880;
  SVar6._80_8_ = local_2878;
  SVar6._88_8_ = local_2870;
  SVar6._96_96_ = _minmax_type;
  SVar6.function.super__Function_base._M_manager =
       (_Manager_type)
       child_types.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  SVar6.function._M_invoker =
       (_Invoker_type)
       child_types.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  SVar6.bind = (bind_scalar_function_t)
               child_types.
               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               .
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  SVar6.bind_extended = (bind_scalar_function_extended_t)_bounded_specialized_type;
  SVar6.init_local_state = (init_local_state_t)uStack_27e8;
  SVar6.statistics = (function_statistics_t)uStack_27e0;
  SVar6.bind_lambda = (bind_lambda_function_t)local_27d8._0_8_;
  SVar6.bind_expression = (function_bind_expression_t)local_27d8._8_8_;
  SVar6.get_modified_databases = (get_modified_databases_t)local_27c8;
  SVar6._264_16_ = local_27c0;
  SVar6.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_27b0;
  SVar6.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_27a8._M_pi;
  duckdb::ExtensionUtil::RegisterFunction(db,SVar6);
  duckdb::ScalarFunction::~ScalarFunction(&local_fc0);
  std::__cxx11::string::string(local_22b8,"bounded_add",(allocator *)&bounded_to_ascii);
  duckdb::LogicalType::LogicalType((LogicalType *)&bounded_even,&bounded_type);
  duckdb::LogicalType::LogicalType((LogicalType *)&bounded_even.field_0x18,&bounded_type);
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)&bounded_even;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_2520,__l_04,(allocator_type *)&bounded_specialized_type);
  duckdb::LogicalType::LogicalType(local_2538,&bounded_type);
  local_2718[1] = (code *)0x0;
  local_2718[0] = BoundedAddFunc;
  local_2700 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_invoke;
  local_2708 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_manager;
  duckdb::LogicalType::LogicalType(local_22d0,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&bounded_add,local_22b8,&local_2520,local_2538,local_2718,BoundedAddBind);
  duckdb::LogicalType::~LogicalType(local_22d0);
  std::_Function_base::~_Function_base((_Function_base *)local_2718);
  duckdb::LogicalType::~LogicalType(local_2538);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2520);
  lVar19 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType
              ((LogicalType *)(&bounded_even.super_BaseScalarFunction + lVar19));
    lVar19 = lVar19 + -0x18;
  } while (lVar19 != -0x18);
  std::__cxx11::string::~string(local_22b8);
  duckdb::ScalarFunction::ScalarFunction(&local_10e8,&bounded_add);
  SVar7._16_8_ = 0;
  SVar7.super_BaseScalarFunction = (BaseScalarFunction)0x0;
  SVar7._1_8_ = 0;
  SVar7._9_7_ = 0;
  SVar7._24_8_ = local_22d0;
  SVar7._32_4_ = 0;
  SVar7._36_4_ = uStack_28a4;
  SVar7._40_4_ = 0;
  SVar7._44_4_ = uStack_289c;
  SVar7._48_8_ = 0;
  SVar7._56_8_ = uStack_2890;
  SVar7._64_8_ = local_2888._M_head_impl;
  SVar7._72_8_ = local_2880;
  SVar7._80_8_ = local_2878;
  SVar7._88_8_ = local_2870;
  SVar7._96_96_ = _minmax_type;
  SVar7.function.super__Function_base._M_manager =
       (_Manager_type)
       child_types.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  SVar7.function._M_invoker =
       (_Invoker_type)
       child_types.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  SVar7.bind = (bind_scalar_function_t)
               child_types.
               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               .
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  SVar7.bind_extended = (bind_scalar_function_extended_t)_bounded_specialized_type;
  SVar7.init_local_state = (init_local_state_t)uStack_27e8;
  SVar7.statistics = (function_statistics_t)uStack_27e0;
  SVar7.bind_lambda = (bind_lambda_function_t)local_27d8._0_8_;
  SVar7.bind_expression = (function_bind_expression_t)local_27d8._8_8_;
  SVar7.get_modified_databases = (get_modified_databases_t)local_27c8;
  SVar7._264_16_ = local_27c0;
  SVar7.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_27b0;
  SVar7.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_27a8._M_pi;
  duckdb::ExtensionUtil::RegisterFunction(db,SVar7);
  duckdb::ScalarFunction::~ScalarFunction(&local_10e8);
  std::__cxx11::string::string(local_22f0,"bounded_even",(allocator *)&bounded_specialized_type);
  duckdb::LogicalType::LogicalType((LogicalType *)&bounded_to_ascii,&bounded_type);
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)&bounded_to_ascii;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_2550,__l_05,(allocator_type *)&minmax_type);
  duckdb::LogicalType::LogicalType(local_2568,BOOLEAN);
  local_2738[1] = (code *)0x0;
  local_2738[0] = BoundedEvenFunc;
  local_2720 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_invoke;
  local_2728 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_manager;
  duckdb::LogicalType::LogicalType(local_2308,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&bounded_even,local_22f0,&local_2550,local_2568,local_2738,0);
  duckdb::LogicalType::~LogicalType(local_2308);
  std::_Function_base::~_Function_base((_Function_base *)local_2738);
  duckdb::LogicalType::~LogicalType(local_2568);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2550);
  duckdb::LogicalType::~LogicalType((LogicalType *)&bounded_to_ascii);
  std::__cxx11::string::~string(local_22f0);
  duckdb::ScalarFunction::ScalarFunction(&local_1210,&bounded_even);
  SVar8._16_8_ = 0;
  SVar8.super_BaseScalarFunction = (BaseScalarFunction)0x0;
  SVar8._1_8_ = 0;
  SVar8._9_7_ = 0;
  SVar8._24_8_ = local_2308;
  SVar8._32_4_ = 0;
  SVar8._36_4_ = uStack_28a4;
  SVar8._40_4_ = 0;
  SVar8._44_4_ = uStack_289c;
  SVar8._48_8_ = 0;
  SVar8._56_8_ = uStack_2890;
  SVar8._64_8_ = local_2888._M_head_impl;
  SVar8._72_8_ = local_2880;
  SVar8._80_8_ = local_2878;
  SVar8._88_8_ = local_2870;
  SVar8._96_96_ = _minmax_type;
  SVar8.function.super__Function_base._M_manager =
       (_Manager_type)
       child_types.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  SVar8.function._M_invoker =
       (_Invoker_type)
       child_types.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  SVar8.bind = (bind_scalar_function_t)
               child_types.
               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               .
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  SVar8.bind_extended = (bind_scalar_function_extended_t)_bounded_specialized_type;
  SVar8.init_local_state = (init_local_state_t)uStack_27e8;
  SVar8.statistics = (function_statistics_t)uStack_27e0;
  SVar8.bind_lambda = (bind_lambda_function_t)local_27d8._0_8_;
  SVar8.bind_expression = (function_bind_expression_t)local_27d8._8_8_;
  SVar8.get_modified_databases = (get_modified_databases_t)local_27c8;
  SVar8._264_16_ = local_27c0;
  SVar8.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_27b0;
  SVar8.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_27a8._M_pi;
  duckdb::ExtensionUtil::RegisterFunction(db,SVar8);
  duckdb::ScalarFunction::~ScalarFunction(&local_1210);
  BoundedType::Get((BoundedType *)&bounded_specialized_type,0xff);
  std::__cxx11::string::string(local_2328,"bounded_ascii",local_2820);
  duckdb::LogicalType::LogicalType(&minmax_type,&bounded_specialized_type);
  __l_06._M_len = 1;
  __l_06._M_array = &minmax_type;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_2580,__l_06,(allocator_type *)((long)&uStack_2890 + 6));
  duckdb::LogicalType::LogicalType(local_2598,VARCHAR);
  local_2758[1] = (code *)0x0;
  local_2758[0] = BoundedToAsciiFunc;
  local_2740 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_invoke;
  local_2748 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_manager;
  duckdb::LogicalType::LogicalType(local_2340,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&bounded_to_ascii,local_2328,&local_2580,local_2598,local_2758,0);
  duckdb::LogicalType::~LogicalType(local_2340);
  std::_Function_base::~_Function_base((_Function_base *)local_2758);
  duckdb::LogicalType::~LogicalType(local_2598);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2580);
  duckdb::LogicalType::~LogicalType(&minmax_type);
  std::__cxx11::string::~string(local_2328);
  duckdb::ScalarFunction::ScalarFunction(&local_1338,&bounded_to_ascii);
  SVar9._16_8_ = 0;
  SVar9.super_BaseScalarFunction = (BaseScalarFunction)0x0;
  SVar9._1_8_ = 0;
  SVar9._9_7_ = 0;
  SVar9._24_8_ = local_2340;
  SVar9._32_4_ = 0;
  SVar9._36_4_ = uStack_28a4;
  SVar9._40_4_ = 0;
  SVar9._44_4_ = uStack_289c;
  SVar9._48_8_ = 0;
  SVar9._56_8_ = uStack_2890;
  SVar9._64_8_ = local_2888._M_head_impl;
  SVar9._72_8_ = local_2880;
  SVar9._80_8_ = local_2878;
  SVar9._88_8_ = local_2870;
  SVar9._96_96_ = _minmax_type;
  SVar9.function.super__Function_base._M_manager =
       (_Manager_type)
       child_types.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  SVar9.function._M_invoker =
       (_Invoker_type)
       child_types.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  SVar9.bind = (bind_scalar_function_t)
               child_types.
               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               .
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  SVar9.bind_extended = (bind_scalar_function_extended_t)_bounded_specialized_type;
  SVar9.init_local_state = (init_local_state_t)uStack_27e8;
  SVar9.statistics = (function_statistics_t)uStack_27e0;
  SVar9.bind_lambda = (bind_lambda_function_t)local_27d8._0_8_;
  SVar9.bind_expression = (function_bind_expression_t)local_27d8._8_8_;
  SVar9.get_modified_databases = (get_modified_databases_t)local_27c8;
  SVar9._264_16_ = local_27c0;
  SVar9.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_27b0;
  SVar9.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_27a8._M_pi;
  duckdb::ExtensionUtil::RegisterFunction(db,SVar9);
  duckdb::ScalarFunction::~ScalarFunction(&local_1338);
  local_2870 = (long *)0x0;
  duckdb::BoundCastInfo::BoundCastInfo
            ((BoundCastInfo *)&local_27a8,BoundedToBoundedCast,&local_2870,0);
  duckdb::ExtensionUtil::RegisterCastFunction
            (db,&bounded_type,&bounded_specialized_type,&local_27a8,0);
  if (local_2798 != (long *)0x0) {
    (**(code **)(*local_2798 + 8))();
  }
  local_2798 = (long *)0x0;
  if (local_2870 != (long *)0x0) {
    (**(code **)(*local_2870 + 8))();
  }
  local_2870 = (long *)0x0;
  duckdb::LogicalType::LogicalType(&minmax_type,INTEGER);
  local_2878 = (long *)0x0;
  duckdb::BoundCastInfo::BoundCastInfo(local_27c0,IntToBoundedCast,&local_2878,0);
  duckdb::ExtensionUtil::RegisterCastFunction(db,&minmax_type,&bounded_type,local_27c0,0);
  if (local_27b0 != (long *)0x0) {
    (**(code **)(*local_27b0 + 8))();
  }
  local_27b0 = (long *)0x0;
  if (local_2878 != (long *)0x0) {
    (**(code **)(*local_2878 + 8))();
  }
  local_2878 = (long *)0x0;
  duckdb::LogicalType::~LogicalType(&minmax_type);
  MinMaxType::GetDefault();
  std::__cxx11::string::string(local_2360,"MINMAX",local_2820);
  duckdb::LogicalType::LogicalType(local_25b0,&minmax_type);
  duckdb::ExtensionUtil::RegisterType(db,local_2360,local_25b0,MinMaxType::Bind);
  duckdb::LogicalType::~LogicalType(local_25b0);
  std::__cxx11::string::~string(local_2360);
  duckdb::LogicalType::LogicalType((LogicalType *)local_2820,INTEGER);
  local_2880 = (long *)0x0;
  duckdb::BoundCastInfo::BoundCastInfo(local_27d8,IntToMinMaxCast,&local_2880,0);
  duckdb::ExtensionUtil::RegisterCastFunction(db,local_2820,&minmax_type,local_27d8,0);
  if (local_27c8 != (long *)0x0) {
    (**(code **)(*local_27c8 + 8))();
  }
  local_27c8 = (long *)0x0;
  if (local_2880 != (long *)0x0) {
    (**(code **)(*local_2880 + 8))();
  }
  local_2880 = (long *)0x0;
  duckdb::LogicalType::~LogicalType((LogicalType *)local_2820);
  std::__cxx11::string::string(local_2380,"minmax_range",(allocator *)((long)&uStack_2890 + 6));
  duckdb::LogicalType::LogicalType((LogicalType *)local_2820,&minmax_type);
  __l_07._M_len = 1;
  __l_07._M_array = (iterator)local_2820;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_25c8,__l_07,(allocator_type *)((long)&uStack_2890 + 7));
  duckdb::LogicalType::LogicalType(local_25e0,INTEGER);
  local_2778[1] = (code *)0x0;
  local_2778[0] = MinMaxRangeFunc;
  local_2760 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_invoke;
  local_2768 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_manager;
  duckdb::LogicalType::LogicalType(local_2398,INVALID);
  duckdb::ScalarFunction::ScalarFunction(&local_1460,local_2380,&local_25c8,local_25e0,local_2778,0)
  ;
  SVar10._16_8_ = 0;
  SVar10.super_BaseScalarFunction = (BaseScalarFunction)0x0;
  SVar10._1_8_ = 0;
  SVar10._9_7_ = 0;
  SVar10._24_8_ = local_2398;
  SVar10._32_4_ = 0;
  SVar10._36_4_ = uStack_28a4;
  SVar10._40_4_ = 0;
  SVar10._44_4_ = uStack_289c;
  SVar10._48_8_ = 0;
  SVar10._56_8_ = uStack_2890;
  SVar10._64_8_ = local_2888._M_head_impl;
  SVar10._72_8_ = local_2880;
  SVar10._80_8_ = local_2878;
  SVar10._88_8_ = local_2870;
  SVar10._96_96_ = _minmax_type;
  SVar10.function.super__Function_base._M_manager =
       (_Manager_type)
       child_types.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  SVar10.function._M_invoker =
       (_Invoker_type)
       child_types.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  SVar10.bind = (bind_scalar_function_t)
                child_types.
                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                .
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  SVar10.bind_extended = (bind_scalar_function_extended_t)_bounded_specialized_type;
  SVar10.init_local_state = (init_local_state_t)uStack_27e8;
  SVar10.statistics = (function_statistics_t)uStack_27e0;
  SVar10.bind_lambda = (bind_lambda_function_t)local_27d8._0_8_;
  SVar10.bind_expression = (function_bind_expression_t)local_27d8._8_8_;
  SVar10.get_modified_databases = (get_modified_databases_t)local_27c8;
  SVar10._264_16_ = local_27c0;
  SVar10.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_27b0;
  SVar10.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_27a8._M_pi;
  duckdb::ExtensionUtil::RegisterFunction(db,SVar10);
  duckdb::ScalarFunction::~ScalarFunction(&local_1460);
  duckdb::LogicalType::~LogicalType(local_2398);
  std::_Function_base::~_Function_base((_Function_base *)local_2778);
  duckdb::LogicalType::~LogicalType(local_25e0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_25c8);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_2820);
  std::__cxx11::string::~string(local_2380);
  duckdb::LogicalType::~LogicalType(&minmax_type);
  duckdb::ScalarFunction::~ScalarFunction(&bounded_to_ascii);
  duckdb::LogicalType::~LogicalType(&bounded_specialized_type);
  duckdb::ScalarFunction::~ScalarFunction(&bounded_even);
  duckdb::ScalarFunction::~ScalarFunction(&bounded_add);
  duckdb::ScalarFunction::~ScalarFunction(&bounded_invert);
  duckdb::ScalarFunction::~ScalarFunction(&bounded_max);
  duckdb::LogicalType::~LogicalType(&bounded_type);
  duckdb::CreateTableFunctionInfo::~CreateTableFunctionInfo(&quack_info);
  duckdb::TableFunction::~TableFunction(&quack_function.super_TableFunction);
  duckdb::CreateScalarFunctionInfo::~CreateScalarFunctionInfo(&loaded_extensions_info);
  duckdb::ScalarFunction::~ScalarFunction(&loaded_extensions);
  duckdb::CreateScalarFunctionInfo::~CreateScalarFunctionInfo(&sub_point_info);
  duckdb::ScalarFunction::~ScalarFunction(&sub_point_func);
  duckdb::CreateScalarFunctionInfo::~CreateScalarFunctionInfo(&add_point_info);
  duckdb::ScalarFunction::~ScalarFunction(&add_point_func);
  duckdb::LogicalType::~LogicalType(&target_type);
  if (local_2888._M_head_impl != (CreateTypeInfo *)0x0) {
    (**(code **)(*(long *)local_2888._M_head_impl + 8))();
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector(&child_types.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
           );
  std::__cxx11::string::~string((string *)&alias_name);
  duckdb::Connection::~Connection(&con);
  duckdb::CreateScalarFunctionInfo::~CreateScalarFunctionInfo(&hello_alias_info);
  return;
}

Assistant:

DUCKDB_EXTENSION_API void loadable_extension_demo_init(duckdb::DatabaseInstance &db) {
	CreateScalarFunctionInfo hello_alias_info(
	    ScalarFunction("test_alias_hello", {}, LogicalType::VARCHAR, TestAliasHello));

	// create a scalar function
	Connection con(db);
	auto &client_context = *con.context;
	auto &catalog = Catalog::GetSystemCatalog(client_context);
	con.BeginTransaction();
	con.CreateScalarFunction<int32_t, string_t>("hello", {LogicalType(LogicalTypeId::VARCHAR)},
	                                            LogicalType(LogicalTypeId::INTEGER), &hello_fun);
	catalog.CreateFunction(client_context, hello_alias_info);

	// Add alias POINT type
	string alias_name = "POINT";
	child_list_t<LogicalType> child_types;
	child_types.push_back(make_pair("x", LogicalType::INTEGER));
	child_types.push_back(make_pair("y", LogicalType::INTEGER));
	auto alias_info = make_uniq<CreateTypeInfo>();
	alias_info->internal = true;
	alias_info->name = alias_name;
	LogicalType target_type = LogicalType::STRUCT(child_types);
	target_type.SetAlias(alias_name);
	alias_info->type = target_type;

	auto type_entry = catalog.CreateType(client_context, *alias_info);
	type_entry->tags["ext:name"] = "loadable_extension_demo";
	type_entry->tags["ext:author"] = "DuckDB Labs";

	// Function add point
	ScalarFunction add_point_func("add_point", {target_type, target_type}, target_type, AddPointFunction);
	CreateScalarFunctionInfo add_point_info(add_point_func);
	auto add_point_entry = catalog.CreateFunction(client_context, add_point_info);
	add_point_entry->tags["ext:name"] = "loadable_extension_demo";
	add_point_entry->tags["ext:author"] = "DuckDB Labs";

	// Function sub point
	ScalarFunction sub_point_func("sub_point", {target_type, target_type}, target_type, SubPointFunction);
	CreateScalarFunctionInfo sub_point_info(sub_point_func);
	auto sub_point_entry = catalog.CreateFunction(client_context, sub_point_info);
	sub_point_entry->tags["ext:name"] = "loadable_extension_demo";
	sub_point_entry->tags["ext:author"] = "DuckDB Labs";

	// Function sub point
	ScalarFunction loaded_extensions("loaded_extensions", {}, LogicalType::VARCHAR, LoadedExtensionsFunction);
	CreateScalarFunctionInfo loaded_extensions_info(loaded_extensions);
	catalog.CreateFunction(client_context, loaded_extensions_info);

	// Quack function
	QuackFunction quack_function;
	CreateTableFunctionInfo quack_info(quack_function);
	catalog.CreateTableFunction(client_context, quack_info);

	con.Commit();

	// add a parser extension
	auto &config = DBConfig::GetConfig(db);
	config.parser_extensions.push_back(QuackExtension());
	config.extension_callbacks.push_back(make_uniq<QuackLoadExtension>());

	// Bounded type
	auto bounded_type = BoundedType::GetDefault();
	ExtensionUtil::RegisterType(db, "BOUNDED", bounded_type, BoundedType::Bind);

	// Example of function inspecting the type property
	ScalarFunction bounded_max("bounded_max", {bounded_type}, LogicalType::INTEGER, BoundedMaxFunc, BoundedMaxBind);
	ExtensionUtil::RegisterFunction(db, bounded_max);

	// Example of function inspecting the type property and returning the same type
	ScalarFunction bounded_invert("bounded_invert", {bounded_type}, bounded_type, BoundedInvertFunc, BoundedInvertBind);
	// bounded_invert.serialize = BoundedReturnSerialize;
	// bounded_invert.deserialize = BoundedReturnDeserialize;
	ExtensionUtil::RegisterFunction(db, bounded_invert);

	// Example of function inspecting the type property of both arguments and returning a new type
	ScalarFunction bounded_add("bounded_add", {bounded_type, bounded_type}, bounded_type, BoundedAddFunc,
	                           BoundedAddBind);
	ExtensionUtil::RegisterFunction(db, bounded_add);

	// Example of function that is generic over the type property (the bound is not important)
	ScalarFunction bounded_even("bounded_even", {bounded_type}, LogicalType::BOOLEAN, BoundedEvenFunc);
	ExtensionUtil::RegisterFunction(db, bounded_even);

	// Example of function that is specialized over type property
	auto bounded_specialized_type = BoundedType::Get(0xFF);
	ScalarFunction bounded_to_ascii("bounded_ascii", {bounded_specialized_type}, LogicalType::VARCHAR,
	                                BoundedToAsciiFunc);
	ExtensionUtil::RegisterFunction(db, bounded_to_ascii);

	// Enable explicit casting to our specialized type
	ExtensionUtil::RegisterCastFunction(db, bounded_type, bounded_specialized_type, BoundCastInfo(BoundedToBoundedCast),
	                                    0);
	// Casts
	ExtensionUtil::RegisterCastFunction(db, LogicalType::INTEGER, bounded_type, BoundCastInfo(IntToBoundedCast), 0);

	// MinMax Type
	auto minmax_type = MinMaxType::GetDefault();
	ExtensionUtil::RegisterType(db, "MINMAX", minmax_type, MinMaxType::Bind);
	ExtensionUtil::RegisterCastFunction(db, LogicalType::INTEGER, minmax_type, BoundCastInfo(IntToMinMaxCast), 0);
	ExtensionUtil::RegisterFunction(
	    db, ScalarFunction("minmax_range", {minmax_type}, LogicalType::INTEGER, MinMaxRangeFunc));
}